

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pass.cc
# Opt level: O1

void kratos::uniquify_generators(Generator *top)

{
  __node_base_ptr *__return_storage_ptr__;
  Context *this;
  pointer pcVar1;
  __node_base_ptr p_Var2;
  bool bVar3;
  _Rb_tree_node_base *p_Var4;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
  aVar5;
  mapped_type *ppGVar6;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
  in_R9;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
  aVar7;
  uint uVar8;
  ulong uVar9;
  long lVar10;
  undefined8 uVar11;
  pair<std::__detail::_Node_iterator<std::pair<const_unsigned_long,_kratos::Generator_*>,_false,_false>,_bool>
  pVar12;
  string_view format_str;
  format_args args;
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  local_188;
  undefined1 local_150 [8];
  set<std::shared_ptr<kratos::Generator>,_std::less<std::shared_ptr<kratos::Generator>_>,_std::allocator<std::shared_ptr<kratos::Generator>_>_>
  module_sets;
  unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  new_names;
  unordered_map<unsigned_long,_kratos::Generator_*,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_kratos::Generator_*>_>_>
  name_map;
  string new_name;
  uint64_t local_88;
  uint64_t hash;
  undefined1 auStack_78 [8];
  string old_name;
  vector<kratos::Generator_*,_std::allocator<kratos::Generator_*>_> module_instances;
  Generator *local_38;
  Generator *ptr;
  
  this = top->context_;
  Context::get_generator_names_abi_cxx11_
            ((unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&local_188,this);
  if (local_188._M_before_begin._M_nxt != (_Hash_node_base *)0x0) {
    __return_storage_ptr__ = &name_map._M_h._M_single_bucket;
    do {
      hash = (uint64_t)local_188._M_before_begin._M_nxt;
      Context::get_generators_by_name
                ((set<std::shared_ptr<kratos::Generator>,_std::less<std::shared_ptr<kratos::Generator>_>,_std::allocator<std::shared_ptr<kratos::Generator>_>_>
                  *)local_150,this,(string *)(local_188._M_before_begin._M_nxt + 1));
      old_name.field_2._8_8_ = 0;
      std::vector<kratos::Generator_*,_std::allocator<kratos::Generator_*>_>::reserve
                ((vector<kratos::Generator_*,_std::allocator<kratos::Generator_*>_> *)
                 (old_name.field_2._M_local_buf + 8),
                 (size_type)module_sets._M_t._M_impl.super__Rb_tree_header._M_header._M_right);
      p_Var4 = module_sets._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
      p_Var2 = new_names._M_h._M_single_bucket;
      while (p_Var4 != (_Rb_tree_node_base *)&module_sets) {
        new_names._M_h._M_single_bucket = *(__node_base_ptr *)(p_Var4 + 1);
        if ((new_names._M_h._M_single_bucket[0x1c]._M_nxt ==
             new_names._M_h._M_single_bucket[0x1d]._M_nxt) &&
           (((ulong)new_names._M_h._M_single_bucket[0x5b]._M_nxt & 0x100) == 0)) {
          std::vector<kratos::Generator*,std::allocator<kratos::Generator*>>::
          emplace_back<kratos::Generator*>
                    ((vector<kratos::Generator*,std::allocator<kratos::Generator*>> *)
                     (old_name.field_2._M_local_buf + 8),
                     (Generator **)&new_names._M_h._M_single_bucket);
          p_Var2 = new_names._M_h._M_single_bucket;
        }
        new_names._M_h._M_single_bucket = p_Var2;
        p_Var4 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var4);
        p_Var2 = new_names._M_h._M_single_bucket;
      }
      new_names._M_h._M_single_bucket = p_Var2;
      if (old_name.field_2._8_8_ != -8) {
        if ((this->track_generated_ == true) && (old_name.field_2._8_8_ != 0)) {
          lVar10 = 0;
          uVar9 = 0;
          do {
            bVar3 = Context::is_generated_tracked
                              (this,*(Generator **)(old_name.field_2._8_8_ + uVar9 * 8));
            if (bVar3) {
              uVar11 = *(undefined8 *)(old_name.field_2._8_8_ + uVar9 * 8);
              *(undefined8 *)(old_name.field_2._8_8_ + uVar9 * 8) =
                   *(undefined8 *)(old_name.field_2._8_8_ + lVar10 * 8);
              *(undefined8 *)(old_name.field_2._8_8_ + lVar10 * 8) = uVar11;
              lVar10 = lVar10 + 1;
            }
            uVar9 = uVar9 + 1;
          } while (uVar9 < (ulong)((long)-old_name.field_2._8_8_ >> 3));
        }
        new_names._M_h._M_single_bucket =
             (__node_base_ptr)&name_map._M_h._M_rehash_policy._M_next_resize;
        name_map._M_h._M_buckets = (__buckets_ptr)0x1;
        name_map._M_h._M_bucket_count = 0;
        name_map._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
        name_map._M_h._M_element_count._0_4_ = 0x3f800000;
        name_map._M_h._M_rehash_policy._M_max_load_factor = 0.0;
        name_map._M_h._M_rehash_policy._4_4_ = 0;
        name_map._M_h._M_rehash_policy._M_next_resize = 0;
        module_sets._M_t._M_impl.super__Rb_tree_header._M_node_count =
             (size_t)&new_names._M_h._M_rehash_policy._M_next_resize;
        new_names._M_h._M_buckets = (__buckets_ptr)0x1;
        new_names._M_h._M_bucket_count = 0;
        new_names._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
        new_names._M_h._M_element_count._0_4_ = 0x3f800000;
        new_names._M_h._M_rehash_policy._M_max_load_factor = 0.0;
        new_names._M_h._M_rehash_policy._4_4_ = 0;
        new_names._M_h._M_rehash_policy._M_next_resize = 0;
        new_name.field_2._8_8_ = 0;
        uVar11 = old_name.field_2._8_8_;
        if (old_name.field_2._8_8_ != 0) {
          do {
            local_38 = *(Generator **)uVar11;
            bVar3 = Context::has_hash(this,local_38);
            if (bVar3) {
              local_88 = Context::get_hash(this,local_38);
              aVar7 = (anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
                       )((anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
                          *)(new_names._M_h._M_single_bucket +
                            local_88 % (ulong)name_map._M_h._M_buckets))->values_;
              aVar5.values_ =
                   (value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
                    *)0x0;
              if ((aVar7.values_ !=
                   (value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
                    *)0x0) &&
                 (in_R9.values_ =
                       (value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
                        *)((aVar7.values_)->field_0).named_args.data, aVar5 = aVar7,
                 aVar7.values_ = in_R9.values_, local_88 != ((in_R9.values_)->field_0).string.size))
              {
                while (in_R9.values_ =
                            (value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
                             *)((aVar7.values_)->field_0).named_args.data,
                      (named_arg_info<char> *)in_R9.values_ != (named_arg_info<char> *)0x0) {
                  uVar9 = ((in_R9.values_)->field_0).string.size;
                  aVar5.values_ =
                       (value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
                        *)0x0;
                  if ((uVar9 % (ulong)name_map._M_h._M_buckets !=
                       local_88 % (ulong)name_map._M_h._M_buckets) ||
                     (aVar5 = aVar7, aVar7.values_ = in_R9.values_, local_88 == uVar9))
                  goto LAB_0018cb66;
                }
                aVar5.values_ =
                     (value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
                      *)0x0;
              }
LAB_0018cb66:
              if ((aVar5.values_ ==
                   (value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
                    *)0x0) || (((aVar5.values_)->field_0).long_long_value == 0)) {
                pVar12 = std::
                         _Hashtable<unsigned_long,std::pair<unsigned_long_const,kratos::Generator*>,std::allocator<std::pair<unsigned_long_const,kratos::Generator*>>,std::__detail::_Select1st,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                         ::_M_emplace<unsigned_long&,kratos::Generator*const&>
                                   ((_Hashtable<unsigned_long,std::pair<unsigned_long_const,kratos::Generator*>,std::allocator<std::pair<unsigned_long_const,kratos::Generator*>>,std::__detail::_Select1st,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                                     *)&new_names._M_h._M_single_bucket,&local_88,&local_38);
                if (new_names._M_h._M_before_begin._M_nxt == (_Hash_node_base *)0x0) {
                  std::
                  _Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                  ::_M_emplace<std::__cxx11::string&>
                            ((_Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                              *)&module_sets._M_t._M_impl.super__Rb_tree_header._M_node_count,
                             &local_38->name,pVar12._8_8_);
                }
                else {
                  uVar8 = (int)new_names._M_h._M_before_begin._M_nxt - 1;
                  do {
                    auStack_78 = *(undefined1 (*) [8])(hash + 8);
                    old_name._M_dataplus._M_p = *(pointer *)(hash + 0x10);
                    old_name._M_string_length = (size_type)uVar8;
                    format_str.size_ = 0x2d;
                    format_str.data_ = (char *)0xa;
                    args.
                    super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
                    .field_1.args_ = in_R9.args_;
                    args.
                    super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
                    .desc_ = (unsigned_long_long)auStack_78;
                    fmt::v7::detail::vformat_abi_cxx11_
                              ((string *)__return_storage_ptr__,(detail *)"{0}_unq{1}",format_str,
                               args);
                    bVar3 = Context::generator_name_exists(this,(string *)__return_storage_ptr__);
                    if (!bVar3) {
                      Context::change_generator_name(this,local_38,(string *)__return_storage_ptr__)
                      ;
                    }
                    if (name_map._M_h._M_single_bucket !=
                        (__node_base_ptr)&new_name._M_string_length) {
                      operator_delete(name_map._M_h._M_single_bucket,new_name._M_string_length + 1);
                    }
                    uVar8 = uVar8 + 1;
                  } while (bVar3);
                  std::
                  _Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                  ::_M_emplace<std::__cxx11::string&>
                            ((_Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                              *)&module_sets._M_t._M_impl.super__Rb_tree_header._M_node_count,
                             &local_38->name);
                }
              }
              else {
                ppGVar6 = std::__detail::
                          _Map_base<unsigned_long,_std::pair<const_unsigned_long,_kratos::Generator_*>,_std::allocator<std::pair<const_unsigned_long,_kratos::Generator_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                          ::at((_Map_base<unsigned_long,_std::pair<const_unsigned_long,_kratos::Generator_*>,_std::allocator<std::pair<const_unsigned_long,_kratos::Generator_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                *)&new_names._M_h._M_single_bucket,&local_88);
                auStack_78 = (undefined1  [8])&old_name._M_string_length;
                pcVar1 = ((*ppGVar6)->name)._M_dataplus._M_p;
                std::__cxx11::string::_M_construct<char*>
                          ((string *)auStack_78,pcVar1,pcVar1 + ((*ppGVar6)->name)._M_string_length)
                ;
                Context::change_generator_name(this,local_38,(string *)auStack_78);
                if (auStack_78 != (undefined1  [8])&old_name._M_string_length) {
                  operator_delete((void *)auStack_78,old_name._M_string_length + 1);
                }
              }
            }
            uVar11 = uVar11 + 8;
          } while (uVar11 != new_name.field_2._8_8_);
        }
        std::
        _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
        ::~_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                       *)&module_sets._M_t._M_impl.super__Rb_tree_header._M_node_count);
        std::
        _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_kratos::Generator_*>,_std::allocator<std::pair<const_unsigned_long,_kratos::Generator_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
        ::~_Hashtable((_Hashtable<unsigned_long,_std::pair<const_unsigned_long,_kratos::Generator_*>,_std::allocator<std::pair<const_unsigned_long,_kratos::Generator_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                       *)&new_names._M_h._M_single_bucket);
      }
      if (old_name.field_2._8_8_ != 0) {
        operator_delete((void *)old_name.field_2._8_8_,-old_name.field_2._8_8_);
      }
      std::
      _Rb_tree<std::shared_ptr<kratos::Generator>,_std::shared_ptr<kratos::Generator>,_std::_Identity<std::shared_ptr<kratos::Generator>_>,_std::less<std::shared_ptr<kratos::Generator>_>,_std::allocator<std::shared_ptr<kratos::Generator>_>_>
      ::~_Rb_tree((_Rb_tree<std::shared_ptr<kratos::Generator>,_std::shared_ptr<kratos::Generator>,_std::_Identity<std::shared_ptr<kratos::Generator>_>,_std::less<std::shared_ptr<kratos::Generator>_>,_std::allocator<std::shared_ptr<kratos::Generator>_>_>
                   *)local_150);
      local_188._M_before_begin._M_nxt = *(_Hash_node_base **)hash;
    } while (local_188._M_before_begin._M_nxt != (_Hash_node_base *)0x0);
  }
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::~_Hashtable(&local_188);
  return;
}

Assistant:

void uniquify_generators(Generator* top) {
    // we assume users has run the hash_generators function
    Context* context = top->context();
    auto const& names = context->get_generator_names();
    for (auto const& name : names) {
        auto const module_sets = context->get_generators_by_name(name);
        std::vector<Generator*> module_instances;
        module_instances.reserve(module_sets.size());
        for (auto const& m : module_sets) {
            if (m->external()) continue;
            module_instances.emplace_back(m.get());
        }
        // notice that since it is a set copied by value, it is fine to iterate through it
        if (module_instances.size() == 1)
            // only one module. we are good
            continue;
        // reordering based on whether it's being tracked
        if (context->track_generated()) {
            // O(n) algorithm. it does not need to be inplace
            uint64_t head = 0;
            for (uint64_t i = 0; i < module_instances.size(); i++) {
                if (context->is_generated_tracked(module_instances[i])) {
                    // swap
                    std::swap(module_instances[i], module_instances[head]);
                    head++;
                }
            }
        }
        std::unordered_map<uint64_t, Generator*> name_map;
        std::unordered_set<std::string> new_names;
        for (auto* const ptr : module_instances) {
            if (context->has_hash(ptr)) {
                uint64_t hash = context->get_hash(ptr);
                if (name_map.find(hash) == name_map.end()) {
                    // need to uniquify it
                    name_map.emplace(hash, ptr);
                    if (new_names.empty()) {
                        // use the original name
                        new_names.emplace(ptr->name);
                    } else {
                        // find a new one
                        uint32_t count = new_names.size() - 1;
                        while (true) {
                            const std::string new_name = ::format("{0}_unq{1}", name, count++);
                            if (!context->generator_name_exists(new_name)) {
                                context->change_generator_name(ptr, new_name);
                                break;
                            }
                        }
                        new_names.emplace(ptr->name);
                    }
                } else {
                    // re-use the old name
                    auto old_name = name_map.at(hash)->name;
                    context->change_generator_name(ptr, old_name);
                }
            }
        }
    }
}